

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainer.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainer::ArchiveOUT(ChProximityContainer *this,ChArchiveOut *marchive)

{
  undefined4 local_2c;
  char *local_28;
  undefined4 *local_20;
  undefined1 local_18;
  
  local_2c = 1;
  if ((marchive->super_ChArchive).use_versions == true) {
    local_28 = "_version";
    local_20 = &local_2c;
    local_18 = 0;
    (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive);
  }
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  return;
}

Assistant:

void ChProximityContainer::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite(1);
    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);
    // serialize all member data:
}